

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fiber.c
# Opt level: O2

void coro__yield_test(sx_fiber_transfer __transfer)

{
  undefined8 *puVar1;
  int iVar2;
  bool bVar3;
  sx_fiber_transfer __transfer_local;
  
  puVar1 = (undefined8 *)__transfer.user;
  __transfer_local.from = __transfer.from;
  __transfer_local.user = puVar1;
  puts("fiber_pass_fn: Start");
  puts("fiber_pass_fn: Pass and continue on next frame ..");
  sx__coro_yield((sx_coro_context *)*puVar1,&__transfer_local.from,1);
  puts("fiber_pass_fn: Continue");
  puts("fiber_pass_fn: Pass and continue on next 100 frames ..");
  sx__coro_yield((sx_coro_context *)*puVar1,&__transfer_local.from,100);
  puts("fiber_pass_fn: Continue next 10 frames");
  iVar2 = 10;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    printf("fiber_pass_fn: Continue frame: %i\n",(ulong)*(uint *)(puVar1 + 1));
    sx__coro_yield((sx_coro_context *)*puVar1,&__transfer_local.from,1);
  }
  puts("fiber_pass_fn: End");
  sx__coro_end((sx_coro_context *)*puVar1,&__transfer_local.from);
  return;
}

Assistant:

sx_coro_declare(yield_test)
{
    coro_data* d = sx_coro_userdata();
    puts("fiber_pass_fn: Start");

    puts("fiber_pass_fn: Pass and continue on next frame ..");
    sx_coro_yield(d->ctx);
    puts("fiber_pass_fn: Continue");

    puts("fiber_pass_fn: Pass and continue on next 100 frames ..");
    sx_coro_yieldn(d->ctx, 100);

    puts("fiber_pass_fn: Continue next 10 frames");
    int i = 0;
    while (i++ < 10) {
        printf("fiber_pass_fn: Continue frame: %i\n", d->frame);
        sx_coro_yield(d->ctx);
    }

    puts("fiber_pass_fn: End");
    sx_coro_end(d->ctx);    // Always call this !
}